

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void multipredict<true>(ftrl *b,base_learner *param_2,example *ec,size_t count,size_t step,
                       polyprediction *pred,bool finalize_predictions)

{
  long *plVar1;
  float *pfVar2;
  vw *in_RCX;
  long in_RDX;
  long *in_RDI;
  long in_R8;
  long in_R9;
  float fVar3;
  size_t c_3;
  size_t c_2;
  size_t c_1;
  multipredict_info<dense_parameters> mp_1;
  multipredict_info<sparse_parameters> mp;
  size_t c;
  vw *all;
  shared_data *in_stack_ffffffffffffff48;
  multipredict_info<sparse_parameters> *in_stack_ffffffffffffff50;
  example *in_stack_ffffffffffffff58;
  vw *pvVar4;
  vw *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  vw *in_stack_ffffffffffffff90;
  vw *local_48;
  
  plVar1 = (long *)*in_RDI;
  for (local_48 = (vw *)0x0; local_48 < in_RCX; local_48 = (vw *)((long)&local_48->sd + 1)) {
    *(undefined4 *)(in_R9 + (long)local_48 * 0x20) = *(undefined4 *)(in_RDX + 0x6830);
  }
  if ((*(byte *)(*in_RDI + 0x3590) & 1) == 0) {
    in_stack_ffffffffffffff88 = (float)*(double *)(*plVar1 + 0x58);
    GD::
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (multipredict_info<dense_parameters> *)in_stack_ffffffffffffff50);
  }
  else {
    in_stack_ffffffffffffff90 = in_RCX;
    GD::
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  if ((*(double *)(*plVar1 + 0x60) != 1.0) || (NAN(*(double *)(*plVar1 + 0x60)))) {
    for (pvVar4 = (vw *)0x0; pvVar4 < in_RCX; pvVar4 = (vw *)((long)&pvVar4->sd + 1)) {
      pfVar2 = (float *)(in_R9 + (long)pvVar4 * 0x20);
      *pfVar2 = (float)*(double *)(*plVar1 + 0x60) * *pfVar2;
    }
  }
  if (((byte)c_3 & 1) != 0) {
    for (pvVar4 = (vw *)0x0; pvVar4 < in_RCX; pvVar4 = (vw *)((long)&pvVar4->sd + 1)) {
      fVar3 = GD::finalize_prediction(in_stack_ffffffffffffff48,0.0);
      *(float *)(in_R9 + (long)pvVar4 * 0x20) = fVar3;
    }
  }
  for (pvVar4 = (vw *)0x0; pvVar4 < in_RCX; pvVar4 = (vw *)((long)&pvVar4->sd + 1)) {
    *(undefined4 *)(in_RDX + 0x6850) = *(undefined4 *)(in_R9 + (long)pvVar4 * 0x20);
    GD::print_audit_features
              (in_stack_ffffffffffffff90,
               (example *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    *(long *)(in_RDX + 0x6820) = in_R8 + *(long *)(in_RDX + 0x6820);
  }
  *(long *)(in_RDX + 0x6820) = *(long *)(in_RDX + 0x6820) - in_R8 * (long)in_RCX;
  return;
}

Assistant:

void multipredict(
    ftrl& b, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *b.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (b.all->weights.sparse)
  {
    GD::multipredict_info<sparse_parameters> mp = {
        count, step, pred, all.weights.sparse_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<sparse_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    GD::multipredict_info<dense_parameters> mp = {count, step, pred, all.weights.dense_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<dense_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = GD::finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      GD::print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}